

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa_io.c
# Opt level: O3

void * IDAGetAdjIDABmem(void *ida_mem,int which)

{
  int *piVar1;
  int *piVar2;
  int line;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    line = 0x248;
  }
  else if (*(int *)((long)ida_mem + 0x848) == 0) {
    msgfmt = "Illegal attempt to call before calling IDAadjInit.";
    line = 0x250;
  }
  else {
    if (which < *(int *)(*(long *)((long)ida_mem + 0x840) + 0x38)) {
      piVar2 = (int *)(*(long *)((long)ida_mem + 0x840) + 0x30);
      do {
        piVar1 = *(int **)piVar2;
        piVar2 = piVar1 + 0x20;
      } while (*piVar1 != which);
      return *(void **)(piVar1 + 4);
    }
    msgfmt = "Illegal value for which.";
    line = 600;
  }
  IDAProcessError((IDAMem)ida_mem,0,line,"IDAGetAdjIDABmem",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                  ,msgfmt);
  return (void *)0x0;
}

Assistant:

void* IDAGetAdjIDABmem(void* ida_mem, int which)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  void* ida_memB;

  /* Is ida_mem valid? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSGAM_NULL_IDAMEM);
    return (NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, 0, __LINE__, __func__, __FILE__, MSGAM_NO_ADJ);
    return (NULL);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, 0, __LINE__, __func__, __FILE__, MSGAM_BAD_WHICH);
    return (NULL);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }
  ida_memB = (void*)IDAB_mem->IDA_mem;

  return (ida_memB);
}